

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)88,(moira::Mode)4,(moira::Size)1>(Moira *this,u16 opcode)

{
  int *piVar1;
  u16 uVar2;
  byte bVar3;
  u32 addr;
  u32 uVar4;
  u32 result;
  uint uVar5;
  
  uVar2 = (this->queue).irc;
  readExt(this);
  uVar5 = opcode & 7;
  addr = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,uVar5);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)1,64ul>(this,addr);
  piVar1 = (int *)((long)this->exec + (ulong)uVar5 * 4 + -0x38);
  *piVar1 = *piVar1 + (-1 - (uint)((~(uint)opcode & 7) == 0));
  uVar5 = (byte)uVar2 | uVar4;
  bVar3 = (byte)uVar5;
  (this->reg).sr.n = (bool)(bVar3 >> 7);
  (this->reg).sr.z = bVar3 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,uVar5);
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}